

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O3

uint64_t __thiscall helics::CommonCore::receiveCountAny(CommonCore *this,LocalFederateId federateID)

{
  FederateStates FVar1;
  FederateState *this_00;
  uint64_t uVar2;
  InvalidIdentifier *this_01;
  string_view message;
  
  this_00 = getFederateAt(this,federateID);
  if (this_00 == (FederateState *)0x0) {
    this_01 = (InvalidIdentifier *)__cxa_allocate_exception(0x28);
    message._M_str = "FederateID is not valid (receiveCountAny)";
    message._M_len = 0x29;
    InvalidIdentifier::InvalidIdentifier(this_01,message);
    __cxa_throw(this_01,&InvalidIdentifier::typeinfo,HelicsException::~HelicsException);
  }
  FVar1 = FederateState::getState(this_00);
  if (FVar1 != CREATED) {
    uVar2 = FederateState::getQueueSize(this_00);
    return uVar2;
  }
  return 0;
}

Assistant:

uint64_t CommonCore::receiveCountAny(LocalFederateId federateID)
{
    auto* fed = getFederateAt(federateID);
    if (fed == nullptr) {
        throw(InvalidIdentifier("FederateID is not valid (receiveCountAny)"));
    }
    if (fed->getState() == FederateStates::CREATED) {
        return 0;
    }

    return fed->getQueueSize();
}